

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O2

bool __thiscall RangeHint::reconcile(RangeHint *this,RangeHint *b)

{
  int iVar1;
  undefined4 extraout_var;
  RangeHint *pRVar3;
  uintb umod;
  long local_18;
  Datatype *pDVar2;
  
  pRVar3 = this;
  if (this->type->size < b->type->size) {
    pRVar3 = b;
    b = this;
  }
  pDVar2 = pRVar3->type;
  local_18 = (b->sstart - pRVar3->sstart) % (long)pDVar2->size;
  local_18 = (local_18 >> 0x3f & (long)pDVar2->size) + local_18;
  while( true ) {
    if (pDVar2 == (Datatype *)0x0) {
      return false;
    }
    iVar1 = b->type->size;
    if (pDVar2->size <= iVar1) break;
    iVar1 = (*pDVar2->_vptr_Datatype[4])(pDVar2,local_18,&local_18);
    pDVar2 = (Datatype *)CONCAT44(extraout_var,iVar1);
  }
  return iVar1 <= pDVar2->size && local_18 == 0;
}

Assistant:

bool RangeHint::reconcile(const RangeHint *b) const

{
  const RangeHint *a = this;
  if (a->type->getSize() < b->type->getSize()) {
    const RangeHint *tmp = b;
    b = a;			// Make sure b is smallest
    a = tmp;
  }
  intb mod = (b->sstart - a->sstart) % a->type->getSize();
  if (mod < 0)
    mod += a->type->getSize();

  Datatype *sub = a->type;
  uintb umod = mod;
  while((sub!=(Datatype *)0)&&(sub->getSize() > b->type->getSize()))
    sub = sub->getSubType(umod,&umod);

  if (sub == (Datatype *)0) return false;
  if (umod != 0) return false;
  if (sub->getSize() < b->type->getSize()) return false;
  return true;
}